

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void globalInit(void)

{
  pc = 0;
  nkw = 0;
  numberVal = 0;
  currentSymbol = 0;
  currentCharacter = '\0';
  intTypeIndex = 0;
  charTypeIndex = 0;
  currentLevel = 0;
  lineNumber = 1;
  procFixList = (procFixStruct *)0x0;
  terminate = 0;
  bigNum = 0x10000;
  RISC_MEMSIZE = 32000;
  firstInstr = (instrStruct *)calloc(1,0x10);
  lastInstr = firstInstr;
  regs[2] = 0;
  regs[3] = 0;
  regs[4] = 0;
  regs[5] = 0;
  regs[6] = 0;
  regs[7] = 0;
  regs[8] = 0;
  regs[9] = 0;
  regs[10] = 0;
  regs[0xb] = 0;
  regs[0xc] = 0;
  regs[0xd] = 0;
  regs[0xe] = 0;
  regs[0xf] = 0;
  regs[0x10] = 0;
  regs[0x11] = 0;
  regs[0x12] = 0;
  regs[0x13] = 0;
  regs[0x14] = 0;
  regs[0x15] = 0;
  regs[0x16] = 0;
  regs[0x17] = 0;
  regs[0x18] = 0;
  regs[0x19] = 0;
  regs[0x1a] = 0;
  regs[0x1b] = 0;
  regs[0] = 1;
  regs[1] = 0;
  return;
}

Assistant:

procedure
void globalInit(void) {
	variable int fac;
	fac = 4; pc = 0; nkw = 0; numberVal = 0; currentSymbol = 0;
	currentCharacter = '\0'; intTypeIndex = 0; charTypeIndex = 0;
	currentLevel = 0; lineNumber = 1; procFixList = NULL; terminate = false;
	bigNum = 16384 * fac; RISC_MEMSIZE = 32000;
	allocMem(firstInstr);
	firstInstr->instr = 0;
	firstInstr->next = NULL;
	lastInstr = firstInstr;
	setupRegister(); 
}